

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void format::append_string<std::__cxx11::string,char_const[8],unsigned_long_long,unsigned_long_long>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output,
               char (*fmt) [8],unsigned_long_long *args,unsigned_long_long *args_1)

{
  char cVar1;
  bool bVar2;
  logic_error *this;
  long lVar3;
  unsigned_long_long *value;
  ulong unaff_R13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  bVar2 = false;
  lVar3 = 0;
  do {
    cVar1 = (*fmt)[lVar3];
    if (cVar1 == '{') {
      bVar2 = true;
      unaff_R13 = 0;
    }
    else if (cVar1 == '}') {
      if (1 < unaff_R13) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this,"A {n} item in format is out of range");
        goto LAB_001054ed;
      }
      value = args;
      if (unaff_R13 != 0) {
        value = args_1;
      }
      local_38 = output;
      format_details::generic_format_value<std::__cxx11::string>::operator()
                ((generic_format_value<std::__cxx11::string> *)&local_38,value);
      bVar2 = false;
    }
    else {
      if (cVar1 == '\0') break;
      if (bVar2) {
        if (9 < (byte)(cVar1 - 0x30U)) {
          this = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this,"Invalid character inside {n} item");
          goto LAB_001054ed;
        }
        unaff_R13 = (ulong)(byte)(cVar1 - 0x30U) + unaff_R13 * 10;
      }
      else {
        std::__cxx11::string::push_back((char)output);
      }
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  if (!bVar2) {
    return;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"Last {n} item was not closed");
LAB_001054ed:
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void append_string(StringType& output,
                     FormatType& fmt,
                     Args&& ... args) {
    bool insideRef = false;
    std::size_t refNumber;

    for (auto chr : fmt) {
      if (!chr)
        break;

      switch (chr) {
        case '{':
          insideRef = true;
          refNumber = 0;
          break;

        case '}':
          if (refNumber < sizeof...(Args)) {
            format_details::variadic_switch(
              refNumber,
              format_details::generic_format_value<StringType>(output),
              std::forward<Args>(args)...);
          }
          else {
            // refNumber is out of range
            throw std::logic_error("A {n} item in format is out of range");
          }
          insideRef = false;
          break;

        default:
          if (insideRef) {
            if (chr >= '0' && chr <= '9') {
              refNumber *= 10;
              refNumber += (chr - '0');
            }
            else
              throw std::logic_error("Invalid character inside {n} item");
          }
          else {
            output.push_back(chr);
          }
          break;
      }
    }

    if (insideRef)
      throw std::logic_error("Last {n} item was not closed");
  }